

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  PromiseArena *pPVar1;
  AsyncPipe *this_00;
  SourceLocation location;
  void *pvVar2;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:854:48)>
  *location_00;
  TransformPromiseNodeBase *this_01;
  StringPtr cancelReason;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_538;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_530;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_528;
  OwnPromiseNode local_520;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_518;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_510;
  anon_class_8_1_8991fb9c_for_func local_508;
  void *continuationTracePtr;
  char *pcStack_4f8;
  undefined8 local_4f0;
  OwnPromiseNode local_4e8;
  NullableValue<kj::Exception> local_4e0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_348 [50];
  NullableValue<kj::Exception> _e1576;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  local_538.ptr = (PromiseNode *)0x0;
  (*this->input->_vptr_AsyncInputStream[1])
            (&local_530,this->input,
             &(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::abortRead()::{lambda()#1}::
              operator()()::junk,1,1);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:854:48)>
       ::anon_class_8_1_8991fb9c_for_func::operator();
  pPVar1 = ((local_530.ptr)->super_PromiseArenaMember).arena;
  local_508.this = this;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_530.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:854:48)>
                   *)((long)pvVar2 + 0x3d8);
    kj::operator()(location_00,&local_530,&local_508,&continuationTracePtr);
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_530.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:854:48)>
                   *)&local_530.ptr[-3].super_PromiseArenaMember.arena;
    kj::operator()(location_00,&local_530,&local_508,&continuationTracePtr);
    local_530.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_528.ptr = (PromiseNode *)0x0;
  local_348[0].ptr = (PromiseNode *)0x0;
  local_520.ptr = (PromiseNode *)location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_348);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_528);
  continuationTracePtr = anon_var_dwarf_864843;
  pcStack_4f8 = "operator()";
  local_4f0 = 0x1000000356;
  pPVar1 = (location_00->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
           arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)location_00 - (long)pPVar1) < 0x30) {
    pvVar2 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_520,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar2 + 0x3d0) = &PTR_destroy_00599d00;
    *(BlockedPumpFrom **)((long)pvVar2 + 0x3f8) = this;
    *(void **)((long)pvVar2 + 0x3d8) = pvVar2;
  }
  else {
    (location_00->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.arena =
         (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)&location_00[-2].func;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_520,kj::_::IdentityFunc<void>::operator());
    location_00[-2].func.this = (BlockedPumpFrom *)&PTR_destroy_00599d00;
    location_00[-1].func.this = this;
    location_00[-1].super_TransformPromiseNodeBase.super_PromiseNode.super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_528.ptr = (PromiseNode *)0x0;
  local_348[0].ptr = (PromiseNode *)0x0;
  local_510.ptr = &this_01->super_PromiseNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_348);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_528);
  location.function = pcStack_4f8;
  location.fileName = (char *)continuationTracePtr;
  location.lineNumber = (undefined4)local_4f0;
  location.columnNumber = local_4f0._4_4_;
  kj::_::spark<kj::_::Void>(&local_4e8,location);
  local_518.ptr = local_4e8.ptr;
  local_4e8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_4e8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_510);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_520);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_530);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(&local_538,&local_518);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_518);
  local_4e0.isSet = false;
  kj::_::NullableValue<kj::Exception>::NullableValue(&_e1576,&local_4e0);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4e0);
  if (_e1576.isSet == true) {
    Promise<void>::Promise((Promise<void> *)&local_4e0,&_e1576.field_1.value);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              (&local_538,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_4e0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_4e0);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_e1576);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->checkEofTask,&local_538);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_538);
  this_00 = this->pipe;
  if ((BlockedPumpFrom *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }